

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderPacked
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          ObjectWriter *ow)

{
  byte *pbVar1;
  pointer pcVar2;
  Limit limit;
  int iVar3;
  int64 iVar4;
  uint first_byte_or_zero;
  CodedInputStream *this_00;
  
  this_00 = this->stream_;
  pbVar1 = this_00->buffer_;
  if (pbVar1 < this_00->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar1;
    if (-1 < (char)*pbVar1) {
      this_00->buffer_ = pbVar1 + 1;
      goto LAB_00315af1;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(this_00,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar4;
  this_00 = this->stream_;
LAB_00315af1:
  limit = io::CodedInputStream::PushLimit(this_00,first_byte_or_zero);
  iVar3 = io::CodedInputStream::BytesUntilLimit(this->stream_);
  if (0 < iVar3) {
    do {
      (*(this->super_ObjectSource)._vptr_ObjectSource[6])(__return_storage_ptr__,this,field,0,0,ow);
      if (__return_storage_ptr__->error_code_ != OK) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->error_message_)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(__return_storage_ptr__->error_message_).field_2) {
        operator_delete(pcVar2);
      }
      iVar3 = io::CodedInputStream::BytesUntilLimit(this->stream_);
    } while (0 < iVar3);
  }
  io::CodedInputStream::PopLimit(this->stream_,limit);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderPacked(
    const google::protobuf::Field* field, ObjectWriter* ow) const {
  uint32 length;
  stream_->ReadVarint32(&length);
  int old_limit = stream_->PushLimit(length);
  while (stream_->BytesUntilLimit() > 0) {
    RETURN_IF_ERROR(RenderField(field, StringPiece(), ow));
  }
  stream_->PopLimit(old_limit);
  return util::Status();
}